

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demand_queue.hpp
# Opt level: O2

demand_unique_ptr_t __thiscall
so_5::disp::prio_one_thread::quoted_round_robin::impl::demand_queue_t::pop(demand_queue_t *this)

{
  long *plVar1;
  _Head_base<0UL,_so_5::disp::mpsc_queue_traits::lock_t_*,_false> _Var2;
  lock_t lVar3;
  long lVar4;
  bool bVar5;
  undefined8 *puVar6;
  undefined8 *puVar7;
  undefined8 *in_RSI;
  
  plVar1 = (long *)*in_RSI;
  (**(code **)(*plVar1 + 0x10))(plVar1);
  while ((*(char *)(in_RSI + 1) == '\0' && (in_RSI[2] == 0))) {
    (**(code **)(*plVar1 + 0x20))(plVar1);
  }
  if (*(char *)(in_RSI + 1) == '\0') {
    puVar7 = (undefined8 *)in_RSI[0x43];
    while (_Var2._M_head_impl = (lock_t *)puVar7[2], _Var2._M_head_impl == (lock_t *)0x0) {
      puVar7[5] = 0;
      bVar5 = puVar7 <= in_RSI + 3;
      puVar7 = puVar7 + -8;
      if (bVar5) {
        puVar7 = in_RSI + 0x3b;
      }
      in_RSI[0x43] = puVar7;
    }
    (this->m_lock)._M_t.
    super___uniq_ptr_impl<so_5::disp::mpsc_queue_traits::lock_t,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>
    ._M_t.
    super__Tuple_impl<0UL,_so_5::disp::mpsc_queue_traits::lock_t_*,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>
    .super__Head_base<0UL,_so_5::disp::mpsc_queue_traits::lock_t_*,_false>._M_head_impl =
         _Var2._M_head_impl;
    lVar3._vptr_lock_t = _Var2._M_head_impl[6]._vptr_lock_t;
    puVar7[2] = lVar3._vptr_lock_t;
    if (lVar3._vptr_lock_t == (_func_int **)0x0) {
      puVar7[3] = 0;
    }
    _Var2._M_head_impl[6]._vptr_lock_t = (_func_int **)0x0;
    LOCK();
    puVar7[7] = puVar7[7] + -1;
    UNLOCK();
    in_RSI[2] = in_RSI[2] + -1;
    puVar7 = (undefined8 *)in_RSI[0x43];
    lVar4 = puVar7[5];
    puVar7[5] = lVar4 + 1U;
    if ((ulong)puVar7[4] <= lVar4 + 1U) {
      puVar7[5] = 0;
      puVar6 = in_RSI + 0x3b;
      if (in_RSI + 3 < puVar7) {
        puVar6 = puVar7 + -8;
      }
      in_RSI[0x43] = puVar6;
    }
    (**(code **)(*plVar1 + 0x18))(plVar1);
    return (__uniq_ptr_data<so_5::disp::prio_one_thread::quoted_round_robin::impl::demand_t,_std::default_delete<so_5::disp::prio_one_thread::quoted_round_robin::impl::demand_t>,_true,_true>
            )(__uniq_ptr_data<so_5::disp::prio_one_thread::quoted_round_robin::impl::demand_t,_std::default_delete<so_5::disp::prio_one_thread::quoted_round_robin::impl::demand_t>,_true,_true>
              )this;
  }
  puVar7 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar7 = &PTR__exception_002cbcf0;
  __cxa_throw(puVar7,&shutdown_ex_t::typeinfo,std::exception::~exception);
}

Assistant:

demand_unique_ptr_t
		pop()
			{
				queue_traits::unique_lock_t lock{ *m_lock };

				while( !m_shutdown && !m_total_demands_count )
					lock.wait_for_notify();

				if( m_shutdown )
					throw shutdown_ex_t();

				// Note: this loop should not be infinitife because
				// m_total_demands_count is not a zero. It means that
				// there is at least one demand somewhere.
				while( !m_current_priority->m_head )
					switch_to_lower_priority();

				// There is a demand to extract.
				demand_unique_ptr_t result{ m_current_priority->m_head };

				m_current_priority->m_head = result->m_next;
				if( !m_current_priority->m_head )
					m_current_priority->m_tail = nullptr;

				result->m_next = nullptr;

				--(m_current_priority->m_demands_count);
				--m_total_demands_count;

				++(m_current_priority->m_demands_processed);

				if( m_current_priority->m_demands_processed >=
						m_current_priority->m_quote )
					{
						// Processing of this priority on the current
						// iteration is finished.
						switch_to_lower_priority();
					}

				return result;
			}